

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

Integer has_negative_elem(Integer g_a,Integer *alo,Integer *ahi)

{
  int iVar1;
  logical lVar2;
  Integer *in_RDX;
  Integer *in_RSI;
  Integer in_RDI;
  Integer loS [7];
  Integer chk;
  Integer jtmp;
  Integer j;
  Integer offset;
  _iterator_hdl hdl;
  Integer me;
  Integer num_blocks;
  Integer iretval;
  char *A_ptr;
  Integer ldA [7];
  Integer hiA [7];
  Integer loA [7];
  Integer adims [7];
  Integer andim;
  Integer atype;
  Integer i;
  Integer aIStackY_4a8 [6];
  Integer *in_stack_fffffffffffffb88;
  char **in_stack_fffffffffffffb90;
  Integer *in_stack_fffffffffffffb98;
  Integer *in_stack_fffffffffffffba0;
  _iterator_hdl *in_stack_fffffffffffffba8;
  _iterator_hdl *in_stack_fffffffffffffc18;
  Integer in_stack_fffffffffffffc20;
  void *in_stack_fffffffffffffc48;
  Integer *in_stack_fffffffffffffc50;
  Integer *in_stack_fffffffffffffc58;
  Integer *in_stack_fffffffffffffc60;
  Integer in_stack_fffffffffffffc68;
  Integer in_stack_fffffffffffffc70;
  Integer *in_stack_fffffffffffffc80;
  Integer in_stack_fffffffffffffce8;
  char *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffd48;
  Integer in_stack_fffffffffffffd50;
  Integer *in_stack_fffffffffffffd58;
  Integer *in_stack_fffffffffffffd60;
  Integer *in_stack_fffffffffffffd68;
  Integer in_stack_fffffffffffffd70;
  long local_128 [8];
  Integer local_e8 [8];
  Integer local_a8 [8];
  long local_68 [7];
  long local_30;
  undefined8 local_28;
  long local_20;
  Integer *local_18;
  Integer *local_10;
  Integer local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pnga_nodeid();
  pnga_sync();
  pnga_check_handle(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  pnga_inquire(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd58);
  pnga_total_blocks(local_8);
  for (local_20 = 0; local_20 < local_30; local_20 = local_20 + 1) {
    if ((local_10[local_20] < 1) || (local_68[local_20] < local_18[local_20])) {
      pnga_error(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    }
  }
  pnga_local_iterator_init(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  do {
    do {
      iVar1 = pnga_local_iterator_next
                        (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                         in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                         in_stack_fffffffffffffb88);
      if (iVar1 == 0) {
        pnga_sync();
        return 0;
      }
      for (in_stack_fffffffffffffba8 = (_iterator_hdl *)0x0;
          (long)in_stack_fffffffffffffba8 < local_30;
          in_stack_fffffffffffffba8 = (_iterator_hdl *)((long)&in_stack_fffffffffffffba8->g_a + 1))
      {
        aIStackY_4a8[(long)in_stack_fffffffffffffba8] = local_a8[(long)in_stack_fffffffffffffba8];
      }
      lVar2 = pnga_patch_intersect(local_10,local_18,local_a8,local_e8,local_30);
    } while (lVar2 == 0);
    in_stack_fffffffffffffb98 = (Integer *)0x1;
    for (in_stack_fffffffffffffba8 = (_iterator_hdl *)0x0;
        (long)in_stack_fffffffffffffba8 < local_30;
        in_stack_fffffffffffffba8 = (_iterator_hdl *)((long)&in_stack_fffffffffffffba8->g_a + 1)) {
      if (aIStackY_4a8[(long)in_stack_fffffffffffffba8] < local_a8[(long)in_stack_fffffffffffffba8])
      {
        in_stack_fffffffffffffb98 = (Integer *)0x0;
        break;
      }
    }
    if (in_stack_fffffffffffffb98 == (Integer *)0x0) {
      in_stack_fffffffffffffba0 = (Integer *)0x1;
      for (in_stack_fffffffffffffba8 = (_iterator_hdl *)0x0;
          (long)in_stack_fffffffffffffba8 < local_30 + -1;
          in_stack_fffffffffffffba8 = (_iterator_hdl *)((long)&in_stack_fffffffffffffba8->g_a + 1))
      {
        in_stack_fffffffffffffba0 =
             (Integer *)
             (local_128[(long)in_stack_fffffffffffffba8] * (long)in_stack_fffffffffffffba0);
      }
      switch(local_28) {
      case 0x3e9:
        break;
      case 0x3ea:
        break;
      case 0x3eb:
        break;
      case 0x3ec:
        break;
      default:
        pnga_error(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        break;
      case 0x3ee:
        break;
      case 0x3ef:
      }
    }
    ngai_has_negative_element
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
               in_stack_fffffffffffffc80);
  } while( true );
}

Assistant:

static Integer has_negative_elem(g_a, alo, ahi)
Integer g_a, *alo, *ahi;    /* patch of g_a */
/*returned value: 1=found; 0 = not found*/
{
  Integer i;
  Integer atype;
  Integer andim, adims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  char *A_ptr; 
  Integer iretval = 0;
  Integer num_blocks;
  Integer me= pnga_nodeid();
  _iterator_hdl hdl;


  pnga_sync();
  pnga_check_handle(g_a, "has_negative_elem");

  pnga_inquire(g_a, &atype, &andim, adims);
  num_blocks = pnga_total_blocks(g_a);

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl, loA, hiA, &A_ptr, ldA)) {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];
    /* loA is changed by pnga_patch_intersect, so
     *            save a copy */
    for (j=0; j<andim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){

      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<andim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<andim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ldA[j];
        }
        offset += (loA[andim-1]-loS[andim-1])*jtmp;
        switch (atype){
          case C_INT:
            A_ptr = (void*)((int*)A_ptr + offset);
            break;
          case C_DCPL:
            A_ptr = (void*)((double*)A_ptr + 2*offset);
            break;
          case C_SCPL:
            A_ptr = (void*)((float*)A_ptr + 2*offset);
            break;
          case C_DBL:
            A_ptr = (void*)((double*)A_ptr + offset);
            break;
          case C_FLOAT:
            A_ptr = (void*)((float*)A_ptr + offset);
            break;
          case C_LONG:
            A_ptr = (void*)((long*)A_ptr + offset);
            break;
          default: pnga_error(" wrong data type ",atype);
        }
      }

      /* check all values in patch */
      ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);
    }
  }
#else
  if (num_blocks < 0) {
    /* find out coordinates of patches of g_a, g_b and g_c that I own */
    pnga_distribution(g_a, me, loA, hiA);
    iretval = 0;
    /*  determine subsets of my patches to access  */
    if (pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
      pnga_access_ptr(g_a, loA, hiA, &A_ptr, ldA);

      ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);

      /* release access to the data */
      pnga_release (g_a, loA, hiA);
    }
  } else {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM], nproc;
    nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {
        /* get limits of patch */
        pnga_distribution(g_a, i, loA, hiA);

        /* loA is changed by pnga_patch_intersect, so
         *            save a copy */
        for (j=0; j<andim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &A_ptr, ldA);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<andim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<andim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ldA[j];
            }
            offset += (loA[andim-1]-loS[andim-1])*jtmp;
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)A_ptr + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((double*)A_ptr + 2*offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((float*)A_ptr + 2*offset);
                break;
              case C_DBL:
                A_ptr = (void*)((double*)A_ptr + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)A_ptr + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)A_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",atype);
            }
          }

          /* check all values in patch */
          ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
        }
        /* loA is changed by pnga_patch_intersect, so
         *            save a copy */
        for (j=0; j<andim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &A_ptr, ldA);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<andim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<andim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ldA[j];
            }
            offset += (loA[andim-1]-loS[andim-1])*jtmp;
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)A_ptr + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((double*)A_ptr + 2*offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((float*)A_ptr + 2*offset);
                break;
              case C_DBL:
                A_ptr = (void*)((double*)A_ptr + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)A_ptr + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)A_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",atype);
            }
          }

          /* check all values in patch */
          ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }

        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  pnga_sync();
  return iretval; /*negative element is not found in g_a*/
}